

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test.hpp
# Opt level: O2

path * __thiscall
libtest::unit_test<libtest::a_plus_b>::small_genfile_path_abi_cxx11_
          (path *__return_storage_ptr__,unit_test<libtest::a_plus_b> *this,usize index,bool in)

{
  allocator<char> local_10a;
  allocator<char> local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  path local_68;
  path local_40;
  
  gen_case_dir_abi_cxx11_();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"small_",&local_109);
  std::__cxx11::to_string(&local_e8,(unsigned_long)this);
  std::operator+(&local_a8,&local_c8,&local_e8);
  if ((char)index == '\0') {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,".out",&local_10a);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,".in",&local_10a);
  }
  std::operator+(&local_88,&local_a8,&local_108);
  std::filesystem::__cxx11::path::path(&local_68,&local_88,auto_format);
  std::filesystem::__cxx11::operator/(__return_storage_ptr__,&local_40,&local_68);
  std::filesystem::__cxx11::path::~path(&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::filesystem::__cxx11::path::~path(&local_40);
  return __return_storage_ptr__;
}

Assistant:

static fs::path small_genfile_path(const usize index, const bool in) { return gen_case_dir() / (std::string("small_") + std::to_string(index) + (in ? std::string(".in") : std::string(".out"))); }